

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void MIR_change_module_ctx(MIR_context_t old_ctx,MIR_module_t_conflict m,MIR_context_t new_ctx)

{
  MIR_module_t pMVar1;
  MIR_context_t item;
  long *plVar2;
  ulong uVar3;
  int iVar4;
  MIR_alias_t MVar5;
  char *pcVar6;
  MIR_context_t string;
  ulong *puVar7;
  MIR_expr_data_t pMVar8;
  char *pcVar9;
  MIR_module_t pMVar10;
  DLIST_LINK_MIR_module_t *pDVar11;
  ulong uVar12;
  MIR_context_t ctx;
  undefined8 *puVar13;
  long lVar14;
  MIR_alias_t *pMVar15;
  MIR_str_t str;
  MIR_item_t_conflict tab_item;
  MIR_item item_s;
  MIR_item_t_conflict tab_item_1;
  MIR_context_t local_120 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  MIR_item local_100;
  MIR_context_t local_b8 [17];
  
  if (m != (MIR_module_t_conflict)0x0) {
    pMVar1 = (m->module_link).prev;
    if (pMVar1 == (MIR_module_t)0x0) {
      if ((old_ctx->all_modules).head != m) goto LAB_00138f9b;
      pMVar10 = (m->module_link).next;
      (old_ctx->all_modules).head = pMVar10;
    }
    else {
      pMVar10 = (m->module_link).next;
      (pMVar1->module_link).next = pMVar10;
    }
    if (pMVar10 == (MIR_module_t)0x0) {
      if ((old_ctx->all_modules).tail != m) goto LAB_00138fa0;
      pDVar11 = (DLIST_LINK_MIR_module_t *)&(old_ctx->all_modules).tail;
    }
    else {
      pDVar11 = &pMVar10->module_link;
    }
    pDVar11->prev = pMVar1;
    (m->module_link).prev = (MIR_module_t)0x0;
    (m->module_link).next = (MIR_module_t)0x0;
    DLIST_MIR_module_t_append(&new_ctx->all_modules,m);
    ctx = new_ctx;
    pcVar6 = get_ctx_str(new_ctx,m->name);
    m->name = pcVar6;
    item = (MIR_context_t)(m->items).head;
    while( true ) {
      if (item == (MIR_context_t)0x0) {
        if (new_ctx->curr_label_num < old_ctx->curr_label_num) {
          new_ctx->curr_label_num = old_ctx->curr_label_num;
        }
        return;
      }
      if (item->temp_string != (VARR_char *)0x0) break;
      string = (MIR_context_t)MIR_item_name(ctx,(MIR_item_t_conflict)item);
      if (string != (MIR_context_t)0x0) {
        pcVar6 = get_ctx_str(new_ctx,(char *)string);
        local_100.u.func = (MIR_func_t)local_b8;
        local_100.item_type = MIR_func_item;
        local_100.module = m;
        local_b8[0] = string;
        iVar4 = HTAB_MIR_item_t_do(old_ctx->module_item_tab,&local_100,HTAB_FIND,
                                   (MIR_item_t_conflict *)local_120);
        if ((iVar4 == 0) || (local_120[0] != item)) {
          ctx = item;
          set_item_name((MIR_item_t_conflict)item,pcVar6);
        }
        else {
          local_b8[0] = item;
          HTAB_MIR_item_t_do(old_ctx->module_item_tab,(MIR_item_t_conflict)item,HTAB_DELETE,
                             (MIR_item_t_conflict *)local_b8);
          set_item_name((MIR_item_t_conflict)item,pcVar6);
          ctx = (MIR_context_t)new_ctx->module_item_tab;
          HTAB_MIR_item_t_do((HTAB_MIR_item_t *)ctx,(MIR_item_t_conflict)item,HTAB_INSERT,
                             (MIR_item_t_conflict *)local_b8);
          if (item != local_b8[0]) goto LAB_00138f77;
        }
      }
      if (*(MIR_item_type_t *)&item->insn_nops == MIR_func_item) {
        plVar2 = (long *)((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[5].name;
        puVar7 = (ulong *)*plVar2;
        if (puVar7 == (ulong *)0x0) goto LAB_00138f72;
        uVar12 = 0;
        puVar13 = (undefined8 *)(puVar7[2] + 0x28);
        while (uVar12 = uVar12 + 1, uVar12 < *puVar7) {
          pcVar6 = get_ctx_str(new_ctx,(char *)puVar13[-1]);
          puVar13[-1] = pcVar6;
          if ((char *)*puVar13 != (char *)0x0) {
            pcVar6 = get_ctx_str(new_ctx,(char *)*puVar13);
            *puVar13 = pcVar6;
          }
          puVar7 = (ulong *)*plVar2;
          puVar13 = puVar13 + 3;
          if (puVar7 == (ulong *)0x0) {
            MIR_change_module_ctx_cold_3();
            goto LAB_00138f61;
          }
        }
        ctx = new_ctx;
        change_var_names(new_ctx,(VARR_MIR_var_t *)
                                 ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data
                                 [3].load_addr);
        pMVar8 = ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data;
        puVar7 = (ulong *)pMVar8[4].name;
        if ((puVar7 != (ulong *)0x0) && (*puVar7 != 0)) {
          lVar14 = 8;
          uVar12 = 0;
          do {
            uVar3 = puVar7[2];
            ctx = new_ctx;
            pcVar6 = get_ctx_str(new_ctx,*(char **)(uVar3 + lVar14));
            *(char **)(uVar3 + lVar14) = pcVar6;
            uVar12 = uVar12 + 1;
            lVar14 = lVar14 + 0x18;
          } while (uVar12 < *puVar7);
          pMVar8 = ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data;
        }
        for (pcVar6 = pMVar8[1].name; pcVar6 != (char *)0x0; pcVar6 = *(char **)(pcVar6 + 0x10)) {
          if (*(int *)(pcVar6 + 0x1c) != 0) {
            pMVar15 = (MIR_alias_t *)(pcVar6 + 0x38);
            uVar12 = 0;
            do {
              if ((char)pMVar15[-4] == '\n') {
                if (pMVar15[-1] != 0) {
                  pcVar9 = MIR_alias_name(old_ctx,pMVar15[-1]);
                  ctx = new_ctx;
                  MVar5 = MIR_alias(new_ctx,pcVar9);
                  pMVar15[-1] = MVar5;
                }
                if (*pMVar15 != 0) {
                  pcVar9 = MIR_alias_name(old_ctx,*pMVar15);
                  ctx = new_ctx;
                  MVar5 = MIR_alias(new_ctx,pcVar9);
                  *pMVar15 = MVar5;
                }
              }
              else if ((char)pMVar15[-4] == '\t') {
                ctx = (MIR_context_t)(local_120 + 1);
                str.s = *(char **)pMVar15;
                str.len = *(size_t *)(pMVar15 + -2);
                string_store((string_t *)ctx,new_ctx,&new_ctx->string_ctx->strings,
                             &new_ctx->string_ctx->string_tab,str);
                *(undefined8 *)(pMVar15 + -2) = local_110;
                *(undefined8 *)pMVar15 = uStack_108;
              }
              uVar12 = uVar12 + 1;
              pMVar15 = pMVar15 + 0xc;
            } while (uVar12 < *(uint *)(pcVar6 + 0x1c));
          }
        }
      }
      else if (*(MIR_item_type_t *)&item->insn_nops == MIR_proto_item) {
        ctx = new_ctx;
        change_var_names(new_ctx,(VARR_MIR_var_t *)
                                 ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data
                                 [1].expr_item);
      }
      item = *(MIR_context_t *)&item->func_redef_permission_p;
    }
LAB_00138f61:
    (*old_ctx->error_func)(MIR_ctx_change_error,"Change context of a loaded module");
LAB_00138f72:
    MIR_change_module_ctx_cold_4();
LAB_00138f77:
    __assert_fail("item == tab_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xb11,"void MIR_change_module_ctx(MIR_context_t, MIR_module_t, MIR_context_t)");
  }
  MIR_change_module_ctx_cold_5();
LAB_00138f9b:
  MIR_change_module_ctx_cold_1();
LAB_00138fa0:
  MIR_change_module_ctx_cold_2();
  if (old_ctx == (MIR_context_t)0x0) {
    __assert_fail("item != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xae5,"void set_item_name(MIR_item_t, const char *)");
  }
  switch(*(undefined4 *)&old_ctx->insn_nops) {
  case 0:
  case 1:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
    old_ctx->used_label_p->els_num = (size_t)m;
    break;
  case 2:
  case 3:
  case 4:
    old_ctx->used_label_p = (VARR_uint8_t *)m;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xaf1,"void set_item_name(MIR_item_t, const char *)");
  }
  return;
}

Assistant:

void MIR_change_module_ctx (MIR_context_t old_ctx, MIR_module_t m, MIR_context_t new_ctx) {
  MIR_item_t item, tab_item;
  MIR_op_mode_t mode;
  const char *name, *new_name;

  DLIST_REMOVE (MIR_module_t, *MIR_get_module_list (old_ctx), m);
  DLIST_APPEND (MIR_module_t, *MIR_get_module_list (new_ctx), m);
  m->name = get_ctx_str (new_ctx, m->name);
  for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item)) {
    if (item->addr != NULL)
      MIR_get_error_func (old_ctx) (MIR_ctx_change_error, "Change context of a loaded module");
    if ((name = MIR_item_name (old_ctx, item)) != NULL) {
      new_name = get_ctx_str (new_ctx, name);
      if (item_tab_find (old_ctx, name, m) != item) {
        set_item_name (item, new_name);
      } else {
        item_tab_remove (old_ctx, item);
        set_item_name (item, new_name);
        tab_item = item_tab_insert (new_ctx, item);
        mir_assert (item == tab_item);
      }
    }
    if (item->item_type == MIR_proto_item) {
      change_var_names (new_ctx, item->u.proto->args);
    } else if (item->item_type == MIR_func_item) {
      func_regs_t func_regs = item->u.func->internal;
      reg_desc_t *rds = VARR_ADDR (reg_desc_t, func_regs->reg_descs);

      for (size_t i = 1; i < VARR_LENGTH (reg_desc_t, func_regs->reg_descs); i++) {
        rds[i].name = (char *) get_ctx_str (new_ctx, rds[i].name);
        if (rds[i].hard_reg_name != NULL)
          rds[i].hard_reg_name = (char *) get_ctx_str (new_ctx, rds[i].hard_reg_name);
      }
      change_var_names (new_ctx, item->u.func->vars);
      if (item->u.func->global_vars != NULL) change_var_names (new_ctx, item->u.func->global_vars);

      for (MIR_insn_t insn = DLIST_HEAD (MIR_insn_t, item->u.func->insns); insn != NULL;
           insn = DLIST_NEXT (MIR_insn_t, insn)) {
        for (size_t i = 0; i < insn->nops; i++) {
          if ((mode = insn->ops[i].mode) == MIR_OP_STR) {
            insn->ops[i].u.str = get_ctx_string (new_ctx, insn->ops[i].u.str).str;
          } else if (mode == MIR_OP_MEM) {
            if (insn->ops[i].u.mem.alias != 0)
              insn->ops[i].u.mem.alias
                = MIR_alias (new_ctx, MIR_alias_name (old_ctx, insn->ops[i].u.mem.alias));
            if (insn->ops[i].u.mem.nonalias != 0)
              insn->ops[i].u.mem.nonalias
                = MIR_alias (new_ctx, MIR_alias_name (old_ctx, insn->ops[i].u.mem.nonalias));
          }
        }
      }
    }
  }
#undef curr_label_num
  if (new_ctx->curr_label_num < old_ctx->curr_label_num)
    new_ctx->curr_label_num = old_ctx->curr_label_num;
#define curr_label_num ctx->curr_label_num
}